

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O1

void __thiscall
cmScriptGenerator::GenerateScriptActionsPerConfig(cmScriptGenerator *this,ostream *os,Indent indent)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  pointer config;
  Indent IVar6;
  string config_test;
  string local_58;
  pointer local_38;
  
  config = (this->ConfigurationTypes->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->ConfigurationTypes->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (config == local_38) {
    GenerateScriptActionsOnce(this,os,indent);
    return;
  }
  bVar1 = true;
  do {
    bVar2 = GeneratesForConfig(this,config);
    if (bVar2) {
      CreateConfigTest(&local_58,this,config);
      IVar6.Level = indent.Level;
      if (0 < indent.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          IVar6.Level = IVar6.Level + -1;
        } while (IVar6.Level != 0);
      }
      pcVar5 = "elseif(";
      if (bVar1) {
        pcVar5 = "if(";
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,(ulong)(byte)~bVar1 * 4 + 3);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_58._M_dataplus._M_p,local_58._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
      (*this->_vptr_cmScriptGenerator[5])(this,os,config,(ulong)(indent.Level + 2U));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      bVar1 = false;
    }
    config = config + 1;
  } while (config != local_38);
  if (!bVar1) {
    iVar3 = (*this->_vptr_cmScriptGenerator[7])(this);
    if ((char)iVar3 != '\0') {
      IVar6.Level = indent.Level;
      if (0 < indent.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          IVar6.Level = IVar6.Level + -1;
        } while (IVar6.Level != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"else()\n",7);
      (*this->_vptr_cmScriptGenerator[6])(this,os,(ulong)(indent.Level + 2U));
    }
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        indent.Level = indent.Level + -1;
      } while (indent.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
  }
  return;
}

Assistant:

void cmScriptGenerator::GenerateScriptActionsPerConfig(std::ostream& os,
                                                       Indent indent)
{
  if (this->ConfigurationTypes->empty()) {
    // In a single-configuration generator there is only one action
    // and it applies if the runtime-requested configuration is among
    // the rule's allowed configurations.  The configuration built in
    // the tree does not matter for this decision but will be used to
    // generate proper target file names into the code.
    this->GenerateScriptActionsOnce(os, indent);
  } else {
    // In a multi-configuration generator we produce a separate rule
    // in a block for each configuration that is built.  We restrict
    // the list of configurations to those to which this rule applies.
    bool first = true;
    for (std::string const& cfgType : *this->ConfigurationTypes) {
      if (this->GeneratesForConfig(cfgType)) {
        // Generate a per-configuration block.
        std::string config_test = this->CreateConfigTest(cfgType);
        os << indent << (first ? "if(" : "elseif(") << config_test << ")\n";
        this->GenerateScriptForConfig(os, cfgType, indent.Next());
        first = false;
      }
    }
    if (!first) {
      if (this->NeedsScriptNoConfig()) {
        os << indent << "else()\n";
        this->GenerateScriptNoConfig(os, indent.Next());
      }
      os << indent << "endif()\n";
    }
  }
}